

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O1

MQTTErrors mqtt_unsubscribe(mqtt_client *client,char *topic_name)

{
  mqtt_pal_mutex_t *__mutex;
  uint8_t *puVar1;
  mqtt_queued_message *pmVar2;
  uint16_t uVar3;
  size_t sVar4;
  mqtt_queued_message *pmVar5;
  size_t sVar6;
  MQTTErrors MVar7;
  
  uVar3 = __mqtt_next_pid(client);
  __mutex = &client->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (client->error < 0) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return client->error;
  }
  sVar4 = mqtt_pack_unsubscribe_request
                    ((client->mq).curr,(client->mq).curr_sz,(uint)uVar3,topic_name,0);
  if ((long)sVar4 < 0) {
LAB_0010325c:
    MVar7 = (MQTTErrors)sVar4;
    client->error = MVar7;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  else {
    if (sVar4 == 0) {
      mqtt_mq_clean(&client->mq);
      sVar4 = mqtt_pack_unsubscribe_request
                        ((client->mq).curr,(client->mq).curr_sz,(uint)uVar3,topic_name,0);
      if ((long)sVar4 < 0) goto LAB_0010325c;
      if (sVar4 == 0) {
        client->error = MQTT_ERROR_SEND_BUFFER_IS_FULL;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        return MQTT_ERROR_SEND_BUFFER_IS_FULL;
      }
    }
    puVar1 = (client->mq).curr;
    pmVar2 = (client->mq).queue_tail;
    (client->mq).queue_tail = pmVar2 + -1;
    pmVar2[-1].start = puVar1;
    pmVar2[-1].size = sVar4;
    pmVar2[-1].state = MQTT_QUEUED_UNSENT;
    pmVar5 = (mqtt_queued_message *)(puVar1 + sVar4);
    sVar6 = (long)(pmVar2 + -2) - (long)pmVar5;
    sVar4 = 0;
    if (pmVar5 <= pmVar2 + -2 && sVar6 != 0) {
      sVar4 = sVar6;
    }
    (client->mq).curr = (uint8_t *)pmVar5;
    (client->mq).curr_sz = sVar4;
    pmVar2[-1].control_type = MQTT_CONTROL_UNSUBSCRIBE;
    pmVar2[-1].packet_id = uVar3;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    MVar7 = MQTT_OK;
  }
  return MVar7;
}

Assistant:

enum MQTTErrors mqtt_unsubscribe(struct mqtt_client *client,
                         const char* topic_name)
{
    uint16_t packet_id = __mqtt_next_pid(client);
    ssize_t rv;
    struct mqtt_queued_message *msg;
    MQTT_PAL_MUTEX_LOCK(&client->mutex);

    /* try to pack the message */
    MQTT_CLIENT_TRY_PACK(
        rv, msg, client, 
        mqtt_pack_unsubscribe_request(
            client->mq.curr, client->mq.curr_sz,
            packet_id,
            topic_name,
            (const char*)NULL
        ), 
        1
    );
    /* save the control type and packet id of the message */
    msg->control_type = MQTT_CONTROL_UNSUBSCRIBE;
    msg->packet_id = packet_id;

    MQTT_PAL_MUTEX_UNLOCK(&client->mutex);
    return MQTT_OK;
}